

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_strtox_main.c
# Opt level: O1

int main(void)

{
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  unsigned_long uVar4;
  char sign;
  char *p;
  char fail [4];
  char test [5];
  char local_31;
  char *local_30;
  char local_24 [12];
  
  pcVar1 = local_24 + 4;
  builtin_strncpy(local_24 + 4,"123_",5);
  builtin_strncpy(local_24,"xxx",4);
  local_31 = '-';
  local_30 = pcVar1;
  piVar3 = _PDCLIB_errno_func();
  *piVar3 = 0;
  uVar4 = _PDCLIB_strtox_main(&local_30,10,999,0xc,3,&local_31);
  if (uVar4 != 0x7b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x49,
           "_PDCLIB_strtox_main( &p, 10u, ( uintmax_t )999, ( uintmax_t )12, 3, &sign ) == 123");
  }
  piVar3 = _PDCLIB_errno_func();
  if (*piVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x4a,"errno == 0");
  }
  pcVar2 = local_24 + 7;
  if (local_30 != pcVar2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x4b,"p == &test[3]");
  }
  local_30 = pcVar1;
  uVar4 = _PDCLIB_strtox_main(&local_30,8,999,0xc,3,&local_31);
  if (uVar4 != 0x53) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x4e,
           "_PDCLIB_strtox_main( &p, 8u, ( uintmax_t )999, ( uintmax_t )12, 3, &sign ) == 0123");
  }
  piVar3 = _PDCLIB_errno_func();
  if (*piVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x4f,"errno == 0");
  }
  if (local_30 != pcVar2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x50,"p == &test[3]");
  }
  local_30 = pcVar1;
  uVar4 = _PDCLIB_strtox_main(&local_30,4,999,1,2,&local_31);
  if (uVar4 != 999) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x53,"_PDCLIB_strtox_main( &p, 4u, ( uintmax_t )999, ( uintmax_t )1, 2, &sign ) == 999")
    ;
  }
  piVar3 = _PDCLIB_errno_func();
  if (*piVar3 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x54,"errno == ERANGE");
  }
  if (local_30 != pcVar2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x55,"p == &test[3]");
  }
  if (local_31 != '+') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x56,"sign == \'+\'");
  }
  piVar3 = _PDCLIB_errno_func();
  *piVar3 = 0;
  local_30 = local_24;
  local_31 = '-';
  uVar4 = _PDCLIB_strtox_main(&local_30,10,999,99,8,&local_31);
  if (uVar4 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x5b,"_PDCLIB_strtox_main( &p, 10u, ( uintmax_t )999, ( uintmax_t )99, 8, &sign ) == 0")
    ;
  }
  if (local_30 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtox_main.c, line %d - %s\n"
           ,0x5c,"p == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    const char * p;
    char test[] = "123_";
    char fail[] = "xxx";
    char sign = '-';
    /* basic functionality */
    p = test;
    errno = 0;
    TESTCASE( _PDCLIB_strtox_main( &p, 10u, ( uintmax_t )999, ( uintmax_t )12, 3, &sign ) == 123 );
    TESTCASE( errno == 0 );
    TESTCASE( p == &test[3] );
    /* proper functioning to smaller base */
    p = test;
    TESTCASE( _PDCLIB_strtox_main( &p, 8u, ( uintmax_t )999, ( uintmax_t )12, 3, &sign ) == 0123 );
    TESTCASE( errno == 0 );
    TESTCASE( p == &test[3] );
    /* overflowing subject sequence must still return proper endptr */
    p = test;
    TESTCASE( _PDCLIB_strtox_main( &p, 4u, ( uintmax_t )999, ( uintmax_t )1, 2, &sign ) == 999 );
    TESTCASE( errno == ERANGE );
    TESTCASE( p == &test[3] );
    TESTCASE( sign == '+' );
    /* testing conversion failure */
    errno = 0;
    p = fail;
    sign = '-';
    TESTCASE( _PDCLIB_strtox_main( &p, 10u, ( uintmax_t )999, ( uintmax_t )99, 8, &sign ) == 0 );
    TESTCASE( p == NULL );
#endif
    return TEST_RESULTS;
}